

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void expr_table(LexState *ls,ExpDesc *e)

{
  BCLine line;
  MSize MVar1;
  FuncState *fs;
  TValue TVar2;
  ExpKind EVar3;
  bool bVar4;
  BCPos BVar5;
  uint uVar6;
  BCReg BVar7;
  int iVar8;
  uint uVar9;
  BCReg BVar10;
  GCstr *pGVar11;
  GCobj *gc;
  TValue *pTVar12;
  ulong uVar13;
  uint32_t hbits;
  long lVar14;
  bool bVar15;
  uint32_t asize;
  GCobj *o;
  BCInsLine *pBVar16;
  uint uVar17;
  TValue local_90;
  uint uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  int local_78;
  BCReg local_74;
  TValue k;
  ExpDesc val;
  
  fs = ls->fs;
  line = ls->linenumber;
  BVar10 = fs->freereg;
  BVar5 = bcemit_INS(fs,BVar10 * 0x100 + 0x32);
  e->k = VNONRELOC;
  (e->u).s.info = BVar10;
  e->t = 0xffffffff;
  e->f = 0xffffffff;
  bcreg_reserve(fs,1);
  local_74 = BVar10 + 1;
  lex_check(ls,0x7b);
  uVar6 = 0;
  uVar17 = 1;
  local_78 = 0;
  bVar4 = false;
  bVar15 = false;
  gc = (GCobj *)0x0;
  do {
    do {
      iVar8 = ls->token;
      if (iVar8 == 0x7d) goto LAB_00118f23;
      if (iVar8 == 0x11f) {
        iVar8 = llex(ls,&ls->lookaheadval);
        ls->lookahead = iVar8;
        if (iVar8 == 0x3d) {
          uStack_88 = 3;
          uStack_84 = 0xffffffff;
          local_90.u32.lo = 0;
          uStack_80 = 0xffffffff;
          pGVar11 = lex_str(ls);
          local_90.u32.lo = (uint32_t)pGVar11;
          local_90.field_2.it = (uint32_t)((ulong)pGVar11 >> 0x20);
          lex_check(ls,0x3d);
          uVar6 = uVar6 + 1;
          goto LAB_00118d1f;
        }
LAB_00118d23:
        uStack_88 = 4;
        uStack_84 = 0xffffffff;
        uStack_80 = 0xffffffff;
        local_90.n = (lua_Number)(int)uVar17;
        uVar17 = uVar17 + 1;
        bVar4 = true;
        bVar15 = bVar4;
      }
      else {
        if (iVar8 != 0x5b) goto LAB_00118d23;
        expr_bracket(ls,(ExpDesc *)&local_90.field_2);
        if (4 < uStack_88) {
          expr_index(fs,e,(ExpDesc *)&local_90.field_2);
        }
        if ((uStack_88 == 4) && (ABS((double)local_90.u64) == 0.0)) {
          bVar4 = true;
        }
        else {
          uVar6 = uVar6 + 1;
        }
        lex_check(ls,0x3d);
LAB_00118d1f:
        bVar15 = false;
      }
      expr(ls,&val);
      if ((uStack_88 - 1 < 4) && ((uStack_88 == 3 || ((val.k < VKCDATA && (val.t == val.f)))))) {
        if (gc == (GCobj *)0x0) {
          asize = uVar17;
          if (!bVar4) {
            asize = 0;
          }
          uVar9 = 0x1f;
          if (uVar6 - 1 != 0) {
            for (; uVar6 - 1 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          hbits = (uVar9 ^ 0xffffffe0) + 0x21;
          if (uVar6 < 2) {
            hbits = uVar6;
          }
          gc = (GCobj *)lj_tab_new(fs->L,asize,hbits);
          BVar7 = const_gc(fs,gc,0xfffffff4);
          fs->bcbase[BVar5].ins = BVar7 << 0x10 | BVar10 * 0x100 | 0x33;
        }
        if (uStack_88 < 3) {
          k.field_2.it = ~uStack_88;
        }
        else {
          k = local_90;
          if (uStack_88 == 3) {
            k.field_2.it = 0xfffffffb;
            k.u32.lo = local_90.u32.lo;
          }
        }
        pTVar12 = lj_tab_set(fs->L,&gc->tab,&k);
        if (((gc->gch).marked & 4) != 0) {
          uVar13 = (ulong)(fs->L->glref).ptr32;
          (gc->gch).marked = (gc->gch).marked & 0xfb;
          (gc->gch).gclist.gcptr32 = *(uint32_t *)(uVar13 + 0x3c);
          *(uint32_t *)(uVar13 + 0x3c) = (uint32_t)gc;
        }
        if ((VKLAST < val.k) || (val.t != val.f)) {
          (pTVar12->u32).lo = (uint32_t)gc;
          (pTVar12->field_2).it = 0xfffffff4;
          bVar15 = false;
          local_78 = 1;
          goto LAB_00118e6d;
        }
        if (val.k < VKSTR) {
          (pTVar12->field_2).it = ~val.k;
        }
        else if (val.k == VKSTR) {
          (pTVar12->field_2).field_0 =
               (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)val.u.s.info;
          (pTVar12->field_2).it = 0xfffffffb;
        }
        else {
          TVar2.field_2.it = val.u.s.aux;
          TVar2.field_2.field_0 =
               (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)val.u.s.info;
          *pTVar12 = TVar2;
        }
        bVar15 = false;
      }
      else {
LAB_00118e6d:
        if (val.k != VCALL) {
          expr_toanyreg(fs,&val);
          bVar15 = false;
        }
        if (uStack_88 < 5) {
          expr_index(fs,e,(ExpDesc *)&local_90.field_2);
        }
        bcemit_store(fs,e,&val);
      }
      fs->freereg = local_74;
      iVar8 = lex_opt(ls,0x2c);
    } while (iVar8 != 0);
    iVar8 = lex_opt(ls,0x3b);
  } while (iVar8 != 0);
LAB_00118f23:
  lex_match(ls,0x7d,0x7b,line);
  if (bVar15) {
    uVar9 = fs->pc - 1;
    pBVar16 = fs->bcbase + uVar9;
    local_90.u32.lo = uVar17 - 1;
    local_90.field_2.it = 0x43300000;
    uStack_88 = 4;
    uStack_84 = 0xffffffff;
    uStack_80 = 0xffffffff;
    if (0x100 < uVar17) {
      fs->pc = uVar9;
      pBVar16 = pBVar16 + -1;
    }
    uVar9 = local_74 << 8;
    BVar10 = const_num(fs,(ExpDesc *)&local_90.field_2);
    pBVar16->ins = BVar10 << 0x10 | uVar9 | 0x3c;
    *(undefined1 *)((long)&pBVar16[-1].ins + 3) = 0;
  }
  if (BVar5 == fs->pc - 1) {
    (e->u).s.info = BVar5;
    fs->freereg = fs->freereg - 1;
    EVar3 = VRELOCABLE;
  }
  else {
    EVar3 = VNONRELOC;
  }
  e->k = EVar3;
  if (gc == (GCobj *)0x0) {
    if (bVar4) {
      if (uVar17 < 3) {
        uVar9 = 3;
      }
      else {
        uVar9 = 0x7ff;
        if (uVar17 < 0x7ff) {
          uVar9 = uVar17;
        }
      }
    }
    else {
      uVar9 = 0;
    }
    if (uVar6 != 0) {
      if (uVar6 == 1) {
        uVar6 = 0x800;
      }
      else {
        uVar17 = 0x1f;
        if (uVar6 - 1 != 0) {
          for (; uVar6 - 1 >> uVar17 == 0; uVar17 = uVar17 - 1) {
          }
        }
        uVar6 = (uVar17 ^ 0x1f) * -0x800 + 0x10000;
      }
    }
    *(ushort *)((long)&fs->bcbase[BVar5].ins + 2) = (ushort)uVar6 | (ushort)uVar9;
  }
  else {
    if ((bVar4) && ((gc->pt).sizekgc < uVar17)) {
      lj_tab_reasize(fs->L,&gc->tab,uVar17 - 1);
    }
    if (local_78 != 0) {
      uVar6 = (gc->uv).dhash;
      MVar1 = (gc->pt).sizekn;
      for (lVar14 = 0; (ulong)(MVar1 + 1) * 0x18 - lVar14 != 0; lVar14 = lVar14 + 0x18) {
        if (*(int *)((ulong)uVar6 + 4 + lVar14) == -0xc) {
          *(undefined4 *)((ulong)uVar6 + 4 + lVar14) = 0xffffffff;
        }
      }
    }
    uVar13 = (ulong)(fs->L->glref).ptr32;
    if (*(uint *)(uVar13 + 0x24) <= *(uint *)(uVar13 + 0x20)) {
      lj_gc_step(fs->L);
    }
  }
  return;
}

Assistant:

static void expr_table(LexState *ls, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  BCLine line = ls->linenumber;
  GCtab *t = NULL;
  int vcall = 0, needarr = 0, fixt = 0;
  uint32_t narr = 1;  /* First array index. */
  uint32_t nhash = 0;  /* Number of hash entries. */
  BCReg freg = fs->freereg;
  BCPos pc = bcemit_AD(fs, BC_TNEW, freg, 0);
  expr_init(e, VNONRELOC, freg);
  bcreg_reserve(fs, 1);
  freg++;
  lex_check(ls, '{');
  while (ls->token != '}') {
    ExpDesc key, val;
    vcall = 0;
    if (ls->token == '[') {
      expr_bracket(ls, &key);  /* Already calls expr_toval. */
      if (!expr_isk(&key)) expr_index(fs, e, &key);
      if (expr_isnumk(&key) && expr_numiszero(&key)) needarr = 1; else nhash++;
      lex_check(ls, '=');
    } else if ((ls->token == TK_name || (!LJ_52 && ls->token == TK_goto)) &&
	       lj_lex_lookahead(ls) == '=') {
      expr_str(ls, &key);
      lex_check(ls, '=');
      nhash++;
    } else {
      expr_init(&key, VKNUM, 0);
      setintV(&key.u.nval, (int)narr);
      narr++;
      needarr = vcall = 1;
    }
    expr(ls, &val);
    if (expr_isk(&key) && key.k != VKNIL &&
	(key.k == VKSTR || expr_isk_nojump(&val))) {
      TValue k, *v;
      if (!t) {  /* Create template table on demand. */
	BCReg kidx;
	t = lj_tab_new(fs->L, needarr ? narr : 0, hsize2hbits(nhash));
	kidx = const_gc(fs, obj2gco(t), LJ_TTAB);
	fs->bcbase[pc].ins = BCINS_AD(BC_TDUP, freg-1, kidx);
      }
      vcall = 0;
      expr_kvalue(&k, &key);
      v = lj_tab_set(fs->L, t, &k);
      lj_gc_anybarriert(fs->L, t);
      if (expr_isk_nojump(&val)) {  /* Add const key/value to template table. */
	expr_kvalue(v, &val);
      } else {  /* Otherwise create dummy string key (avoids lj_tab_newkey). */
	settabV(fs->L, v, t);  /* Preserve key with table itself as value. */
	fixt = 1;   /* Fix this later, after all resizes. */
	goto nonconst;
      }
    } else {
    nonconst:
      if (val.k != VCALL) { expr_toanyreg(fs, &val); vcall = 0; }
      if (expr_isk(&key)) expr_index(fs, e, &key);
      bcemit_store(fs, e, &val);
    }
    fs->freereg = freg;
    if (!lex_opt(ls, ',') && !lex_opt(ls, ';')) break;
  }
  lex_match(ls, '}', '{', line);
  if (vcall) {
    BCInsLine *ilp = &fs->bcbase[fs->pc-1];
    ExpDesc en;
    lua_assert(bc_a(ilp->ins) == freg &&
	       bc_op(ilp->ins) == (narr > 256 ? BC_TSETV : BC_TSETB));
    expr_init(&en, VKNUM, 0);
    en.u.nval.u32.lo = narr-1;
    en.u.nval.u32.hi = 0x43300000;  /* Biased integer to avoid denormals. */
    if (narr > 256) { fs->pc--; ilp--; }
    ilp->ins = BCINS_AD(BC_TSETM, freg, const_num(fs, &en));
    setbc_b(&ilp[-1].ins, 0);
  }
  if (pc == fs->pc-1) {  /* Make expr relocable if possible. */
    e->u.s.info = pc;
    fs->freereg--;
    e->k = VRELOCABLE;
  } else {
    e->k = VNONRELOC;  /* May have been changed by expr_index. */
  }
  if (!t) {  /* Construct TNEW RD: hhhhhaaaaaaaaaaa. */
    BCIns *ip = &fs->bcbase[pc].ins;
    if (!needarr) narr = 0;
    else if (narr < 3) narr = 3;
    else if (narr > 0x7ff) narr = 0x7ff;
    setbc_d(ip, narr|(hsize2hbits(nhash)<<11));
  } else {
    if (needarr && t->asize < narr)
      lj_tab_reasize(fs->L, t, narr-1);
    if (fixt) {  /* Fix value for dummy keys in template table. */
      Node *node = noderef(t->node);
      uint32_t i, hmask = t->hmask;
      for (i = 0; i <= hmask; i++) {
	Node *n = &node[i];
	if (tvistab(&n->val)) {
	  lua_assert(tabV(&n->val) == t);
	  setnilV(&n->val);  /* Turn value into nil. */
	}
      }
    }
    lj_gc_check(fs->L);
  }
}